

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcConversionBasedUnit::IfcConversionBasedUnit
          (IfcConversionBasedUnit *this)

{
  *(undefined8 *)&this->field_0x78 = 0;
  *(char **)&this->field_0x80 = "IfcConversionBasedUnit";
  (this->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
  aux_is_derived.super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)
   &(this->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
    field_0x10 = 0;
  *(undefined1 **)
   &(this->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
    field_0x18 = &(this->super_IfcNamedUnit).field_0x28;
  *(undefined8 *)
   &(this->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
    field_0x20 = 0;
  (this->super_IfcNamedUnit).field_0x28 = 0;
  *(undefined8 *)&(this->super_IfcNamedUnit).field_0x40 = 0;
  (this->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x9a29d0;
  *(undefined8 *)&this->field_0x70 = 0x9a2a20;
  *(undefined8 *)&(this->super_IfcNamedUnit).field_0x38 = 0x9a29f8;
  *(undefined1 **)&(this->super_IfcNamedUnit).field_0x48 = &this->field_0x58;
  *(undefined8 *)&this->field_0x50 = 0;
  this->field_0x58 = 0;
  (this->ConversionFactor).obj = (LazyObject *)0x0;
  return;
}

Assistant:

IfcConversionBasedUnit() : Object("IfcConversionBasedUnit") {}